

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDManagedMeshFragment::ReserveCapacity(ON_SubDManagedMeshFragment *this,uint display_density)

{
  uint uVar1;
  uint uVar2;
  ON_SubDMeshFragmentGrid local_50;
  uint local_20;
  uint local_1c;
  uint vertex_capacity;
  uint display_density_local;
  ON_SubDManagedMeshFragment *this_local;
  
  local_1c = display_density;
  _vertex_capacity = this;
  Clear(this);
  if (local_1c < 7) {
    uVar1 = ON_SubDMeshFragment::PointCountFromDisplayDensity(local_1c);
    local_20 = uVar1;
    uVar2 = ON_SubDMeshFragment::VertexCapacity(&this->super_ON_SubDMeshFragment);
    if (uVar2 < uVar1) {
      ON_SubDMeshFragment::DeleteManagedArrays(&this->super_ON_SubDMeshFragment);
      ON_SubDMeshFragment::ClearControlNetQuad(&this->super_ON_SubDMeshFragment);
      ON_SubDMeshFragment::Internal_LayoutArrays
                (&this->super_ON_SubDMeshFragment,(ulong)local_20,(double *)0x0);
    }
    ON_SubDMeshFragment::SetVertexCount(&this->super_ON_SubDMeshFragment,(ulong)local_20);
    ON_SubDMeshFragment::ClearSurfaceBoundingBox(&this->super_ON_SubDMeshFragment);
    ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(&local_50,local_1c,0);
    memcpy(&(this->super_ON_SubDMeshFragment).m_grid,&local_50,0x30);
    if ((this->super_ON_SubDMeshFragment).m_grid.m_F == (uint *)0x0) {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDManagedMeshFragment::ReserveCapacity(
  unsigned int display_density
) ON_NOEXCEPT
{
  Clear();

  if ( display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(false);


  const unsigned int vertex_capacity = ON_SubDManagedMeshFragment::PointCountFromDisplayDensity(display_density);
  if (vertex_capacity > this->VertexCapacity())
  {
    this->DeleteManagedArrays();
    ClearControlNetQuad();
    // ON_SubDManagedMeshFragment manages m_storage and m_P[]/m_N[]/m_T[]/m_K[]/m_C[]) 
    // are not managed by ON_SubDMeshFragment.
    // (ON_SubDManagedMeshFragment is a legacy class that should not be used 
    // and this confusing situation is an artifact from early code.)
    Internal_LayoutArrays( vertex_capacity, nullptr );
  }
  SetVertexCount(vertex_capacity);

  ClearSurfaceBoundingBox();

  m_grid = ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density,0U);
  if ( nullptr == m_grid.m_F)
    return ON_SUBD_RETURN_ERROR(false);

  return true;
}